

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O0

void ReadStringFromFile(FILE *file_ptr,string *str)

{
  ostream *poVar1;
  ostream *poVar2;
  ulong in_RSI;
  long in_RDI;
  size_t in_stack_000000b8;
  char *in_stack_000000c0;
  FILE *in_stack_000000c8;
  size_t len;
  Logger *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffeb8;
  allocator *function;
  undefined8 in_stack_fffffffffffffec0;
  int line;
  string *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  LogSeverity severity;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [36];
  Logger local_84;
  ulong local_80;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  Logger local_14;
  ulong local_10;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  if (in_RDI == 0) {
    Logger::Logger(&local_14,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"ReadStringFromFile",&local_71);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffec8,line,in_stack_fffffffffffffeb8);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x135);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"file_ptr");
    std::operator<<(poVar1," == NULL \n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger(in_stack_fffffffffffffe50);
    abort();
  }
  local_80 = 0;
  local_10 = in_RSI;
  ReadDataFromDisk(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  if (local_80 == 0) {
    Logger::Logger(&local_84,ERR);
    function = &local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,function);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"ReadStringFromFile",&local_d1);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffec8,line,(string *)function);
    poVar1 = std::operator<<(poVar1,"CHECK_GT failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x139);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"len");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_80);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"0");
    poVar1 = std::operator<<(poVar1," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar1,0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    Logger::~Logger((Logger *)poVar1);
    abort();
  }
  std::__cxx11::string::string(local_f8);
  std::__cxx11::string::swap(local_f8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::resize(local_10);
  std::__cxx11::string::data();
  ReadDataFromDisk(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  return;
}

Assistant:

inline void ReadStringFromFile(FILE *file_ptr, std::string &str) {
  CHECK_NOTNULL(file_ptr);
  // First, read the length of vector
  size_t len = 0;
  ReadDataFromDisk(file_ptr, reinterpret_cast<char *>(&len), sizeof(len));
  CHECK_GT(len, 0);
  // Clear the original string
  std::string().swap(str);
  str.resize(len);
  ReadDataFromDisk(file_ptr, const_cast<char *>(str.data()), len);
}